

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_lpf_config *
ma_lpf_config_init(ma_lpf_config *__return_storage_ptr__,ma_format format,ma_uint32 channels,
                  ma_uint32 sampleRate,double cutoffFrequency,ma_uint32 order)

{
  ma_uint32 mVar1;
  
  *(undefined8 *)&__return_storage_ptr__->order = 0;
  *(undefined8 *)&__return_storage_ptr__->sampleRate = 0;
  __return_storage_ptr__->cutoffFrequency = 0.0;
  __return_storage_ptr__->format = format;
  __return_storage_ptr__->channels = channels;
  __return_storage_ptr__->sampleRate = sampleRate;
  __return_storage_ptr__->cutoffFrequency = cutoffFrequency;
  mVar1 = 8;
  if (order < 8) {
    mVar1 = order;
  }
  __return_storage_ptr__->order = mVar1;
  return __return_storage_ptr__;
}

Assistant:

MA_API ma_lpf_config ma_lpf_config_init(ma_format format, ma_uint32 channels, ma_uint32 sampleRate, double cutoffFrequency, ma_uint32 order)
{
    ma_lpf_config config;

    MA_ZERO_OBJECT(&config);
    config.format          = format;
    config.channels        = channels;
    config.sampleRate      = sampleRate;
    config.cutoffFrequency = cutoffFrequency;
    config.order           = ma_min(order, MA_MAX_FILTER_ORDER);

    return config;
}